

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_entity_t
ecs_find_in_type(ecs_world_t *world,ecs_type_t type,ecs_entity_t component,ecs_entity_t flags)

{
  _Bool _Var1;
  int32_t iVar2;
  void *pvVar3;
  ulong uVar4;
  ecs_type_t type_00;
  ecs_type_t component_type;
  ecs_entity_t e;
  ecs_entity_t c;
  ecs_entity_t *c_ptr;
  ecs_entity_t *c_ptr_array;
  int c_ptr_count;
  int c_ptr_i;
  ecs_entity_t flags_local;
  ecs_entity_t component_local;
  ecs_type_t type_local;
  ecs_world_t *world_local;
  
  iVar2 = ecs_vector_count(type);
  pvVar3 = _ecs_vector_first(type,8,0x10);
  c_ptr_array._4_4_ = 0;
  do {
    if (iVar2 <= c_ptr_array._4_4_) {
      return 0;
    }
    uVar4 = *(ulong *)((long)pvVar3 + (long)c_ptr_array._4_4_ * 8);
    if ((flags == 0) || ((uVar4 & flags) == flags)) {
      uVar4 = uVar4 & 0xffffffffffffff;
      if (component == 0) {
        return uVar4;
      }
      type_00 = ecs_get_type(world,uVar4);
      _Var1 = ecs_type_has_entity(world,type_00,component);
      if (_Var1) {
        return uVar4;
      }
    }
    c_ptr_array._4_4_ = c_ptr_array._4_4_ + 1;
  } while( true );
}

Assistant:

ecs_entity_t ecs_find_in_type(
    ecs_world_t *world,
    ecs_type_t type,
    ecs_entity_t component,
    ecs_entity_t flags)
{
    ecs_vector_each(type, ecs_entity_t, c_ptr, {
        ecs_entity_t c = *c_ptr;

        if (flags) {
            if ((c & flags) != flags) {
                continue;
            }
        }

        ecs_entity_t e = c & ECS_COMPONENT_MASK;

        if (component) {
           ecs_type_t component_type = ecs_get_type(world, e);
           if (!ecs_type_has_entity(world, component_type, component)) {
               continue;
           }
        }

        return e;
    });

    return 0;
}